

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int push_signature_algorithms(ptls_buffer_t *sendbuf)

{
  size_t sVar1;
  size_t body_size;
  undefined1 local_30;
  undefined1 local_2f;
  uint16_t _v_3;
  undefined1 local_2c;
  undefined1 local_2b;
  uint16_t _v_2;
  uint16_t _v_1;
  size_t sStack_28;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  ptls_buffer_t *ppStack_10;
  int ret;
  ptls_buffer_t *sendbuf_local;
  
  body_start = 2;
  ppStack_10 = sendbuf;
  capacity._4_4_ = ptls_buffer__do_pushv(sendbuf,"",2);
  if (capacity._4_4_ == 0) {
    sStack_28 = ppStack_10->off;
    _v_2 = 0x804;
    local_2c = 8;
    local_2b = 4;
    capacity._4_4_ = ptls_buffer__do_pushv(ppStack_10,&local_2c,2);
    if (capacity._4_4_ == 0) {
      _v_3 = 0x403;
      local_30 = 4;
      local_2f = 3;
      capacity._4_4_ = ptls_buffer__do_pushv(ppStack_10,&local_30,2);
      if (capacity._4_4_ == 0) {
        body_size._6_2_ = 0x401;
        body_size._4_1_ = 4;
        body_size._5_1_ = 1;
        capacity._4_4_ = ptls_buffer__do_pushv(ppStack_10,(void *)((long)&body_size + 4),2);
        if (capacity._4_4_ == 0) {
          body_size._2_2_ = 0x201;
          body_size._0_1_ = 2;
          body_size._1_1_ = 1;
          capacity._4_4_ = ptls_buffer__do_pushv(ppStack_10,&body_size,2);
          if (capacity._4_4_ == 0) {
            sVar1 = ppStack_10->off;
            for (; body_start != 0; body_start = body_start - 1) {
              ppStack_10->base[sStack_28 - body_start] =
                   (uint8_t)(sVar1 - sStack_28 >> (((char)body_start + -1) * '\b' & 0x3fU));
            }
            capacity._4_4_ = 0;
          }
        }
      }
    }
  }
  return capacity._4_4_;
}

Assistant:

static int push_signature_algorithms(ptls_buffer_t *sendbuf)
{
    int ret;

    ptls_buffer_push_block(sendbuf, 2, {
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PSS_RSAE_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_ECDSA_SECP256R1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA256);
        ptls_buffer_push16(sendbuf, PTLS_SIGNATURE_RSA_PKCS1_SHA1);
    });

    ret = 0;
Exit:
    return ret;
}